

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O3

int __thiscall TPZGaussRule::ComputingGaussLegendreQuadrature(TPZGaussRule *this,int order)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (int)((double)(order + 2) * 0.51);
  iVar3 = 1;
  if (1 < iVar1) {
    iVar3 = iVar1;
  }
  iVar2 = 999;
  if (iVar1 < 0x3e9) {
    iVar2 = iVar3;
  }
  this->fNumInt = iVar2;
  ComputingGaussLegendreQuadrature(this,&this->fNumInt,&this->fLocation,&this->fWeight);
  return iVar2 * 2 + -2;
}

Assistant:

int TPZGaussRule::ComputingGaussLegendreQuadrature(int order) {
	// Computing number of points appropriated to the wished order = 2*npoints - 1. Note: If odd we need increment one point more
	fNumInt = (int)(0.51*(order+2));
	if(fNumInt < 1)
		fNumInt = 1;
	if(fNumInt > TPZGaussRule::NRULESLEGENDRE_ORDER) 
		fNumInt = TPZGaussRule::NRULESLEGENDRE_ORDER-1;

    order = (fNumInt-1)*2;
	ComputingGaussLegendreQuadrature(&fNumInt,fLocation,fWeight);
    return order;
}